

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void DitherCombine8x8_C(uint8_t *dither,uint8_t *dst,int dst_stride)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [14];
  undefined1 auVar12 [15];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  uint uVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [14];
  uint uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  unkuint9 Var33;
  undefined1 auVar34 [11];
  undefined1 auVar35 [14];
  undefined1 auVar36 [15];
  undefined1 auVar37 [11];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  uint6 uVar43;
  uint6 uVar44;
  long lVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  
  lVar45 = 0;
  do {
    uVar1 = *(ulong *)(dither + lVar45 * 8);
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar1;
    auVar10[0xe] = (char)(uVar1 >> 0x38);
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14[0xc] = (char)(uVar1 >> 0x30);
    auVar14._13_2_ = auVar10._13_2_;
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16._12_3_ = auVar14._12_3_;
    uVar18 = auVar16._11_4_;
    auVar19._8_2_ = 0;
    auVar19._0_8_ = uVar1;
    auVar19[10] = (char)(uVar1 >> 0x28);
    auVar19._11_4_ = uVar18;
    auVar24._8_2_ = 0;
    auVar24._0_8_ = uVar1;
    auVar24._10_5_ = auVar19._10_5_;
    auVar26[8] = (char)(uVar1 >> 0x20);
    auVar26._0_8_ = uVar1;
    auVar26._9_6_ = auVar24._9_6_;
    auVar32._7_8_ = 0;
    auVar32._0_7_ = auVar26._8_7_;
    Var33 = CONCAT81(SUB158(auVar32 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar39._9_6_ = 0;
    auVar39._0_9_ = Var33;
    auVar34._1_10_ = SUB1510(auVar39 << 0x30,5);
    auVar34[0] = (char)(uVar1 >> 0x10);
    auVar40._11_4_ = 0;
    auVar40._0_11_ = auVar34;
    auVar28[2] = (char)(uVar1 >> 8);
    auVar28._0_2_ = (ushort)uVar1;
    auVar28._3_12_ = SUB1512(auVar40 << 0x20,3);
    auVar30._2_13_ = auVar28._2_13_;
    auVar30._0_2_ = (ushort)uVar1 & 0xff;
    auVar11._10_2_ = 0;
    auVar11._0_10_ = auVar30._0_10_;
    auVar11._12_2_ = (short)Var33;
    uVar43 = CONCAT42(auVar11._10_4_,auVar34._0_2_);
    auVar35._6_8_ = 0;
    auVar35._0_6_ = uVar43;
    auVar20._4_2_ = auVar28._2_2_;
    auVar20._0_4_ = auVar30._0_4_;
    auVar20._6_8_ = SUB148(auVar35 << 0x40,6);
    uVar1 = *(ulong *)dst;
    auVar12._8_6_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12[0xe] = (char)(uVar1 >> 0x38);
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15[0xc] = (char)(uVar1 >> 0x30);
    auVar15._13_2_ = auVar12._13_2_;
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar1;
    auVar17._12_3_ = auVar15._12_3_;
    uVar21 = auVar17._11_4_;
    auVar22._8_2_ = 0;
    auVar22._0_8_ = uVar1;
    auVar22[10] = (char)(uVar1 >> 0x28);
    auVar22._11_4_ = uVar21;
    auVar25._8_2_ = 0;
    auVar25._0_8_ = uVar1;
    auVar25._10_5_ = auVar22._10_5_;
    auVar27[8] = (char)(uVar1 >> 0x20);
    auVar27._0_8_ = uVar1;
    auVar27._9_6_ = auVar25._9_6_;
    auVar36._7_8_ = 0;
    auVar36._0_7_ = auVar27._8_7_;
    Var33 = CONCAT81(SUB158(auVar36 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar41._9_6_ = 0;
    auVar41._0_9_ = Var33;
    auVar37._1_10_ = SUB1510(auVar41 << 0x30,5);
    auVar37[0] = (char)(uVar1 >> 0x10);
    auVar42._11_4_ = 0;
    auVar42._0_11_ = auVar37;
    auVar29[2] = (char)(uVar1 >> 8);
    auVar29._0_2_ = (ushort)uVar1;
    auVar29._3_12_ = SUB1512(auVar42 << 0x20,3);
    auVar31._2_13_ = auVar29._2_13_;
    auVar31._0_2_ = (ushort)uVar1 & 0xff;
    auVar13._10_2_ = 0;
    auVar13._0_10_ = auVar31._0_10_;
    auVar13._12_2_ = (short)Var33;
    uVar44 = CONCAT42(auVar13._10_4_,auVar37._0_2_);
    auVar38._6_8_ = 0;
    auVar38._0_6_ = uVar44;
    auVar23._4_2_ = auVar29._2_2_;
    auVar23._0_4_ = auVar31._0_4_;
    auVar23._6_8_ = SUB148(auVar38 << 0x40,6);
    auVar46._0_4_ = (auVar31._0_4_ & 0xffff) + ((int)((auVar30._0_4_ & 0xffff) - 0x78) >> 4);
    auVar46._4_4_ = auVar23._4_4_ + (auVar20._4_4_ + -0x78 >> 4);
    auVar46._8_4_ = (int)uVar44 + ((int)uVar43 + -0x78 >> 4);
    auVar46._12_4_ = (auVar13._10_4_ >> 0x10) + ((int)((auVar11._10_4_ >> 0x10) - 0x78) >> 4);
    auVar47._0_4_ = (uint)auVar27._8_2_ + ((int)(auVar26._8_2_ - 0x78) >> 4);
    auVar47._4_4_ = (uint)auVar22._10_2_ + ((int)(auVar19._10_2_ - 0x78) >> 4);
    auVar47._8_4_ = (uVar21 >> 8 & 0xffff) + ((int)((uVar18 >> 8 & 0xffff) - 0x78) >> 4);
    auVar47._12_4_ = (uVar21 >> 0x18) + ((int)((uVar18 >> 0x18) - 0x78) >> 4);
    auVar47 = packssdw(auVar46,auVar47);
    sVar2 = auVar47._0_2_;
    sVar3 = auVar47._2_2_;
    sVar4 = auVar47._4_2_;
    sVar5 = auVar47._6_2_;
    sVar6 = auVar47._8_2_;
    sVar7 = auVar47._10_2_;
    sVar8 = auVar47._12_2_;
    sVar9 = auVar47._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar47[0xe] - (0xff < sVar9),
                  CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar47[0xc] - (0xff < sVar8),
                           CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar47[10] - (0xff < sVar7),
                                    CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar47[8] -
                                             (0xff < sVar6),
                                             CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar47[6] -
                                                      (0xff < sVar5),
                                                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                               auVar47[4] - (0xff < sVar4),
                                                               CONCAT11((0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar47[2]
                                                                        - (0xff < sVar3),
                                                                        (0 < sVar2) *
                                                                        (sVar2 < 0x100) * auVar47[0]
                                                                        - (0xff < sVar2))))))));
    dst = (uint8_t *)((long)dst + (long)dst_stride);
    lVar45 = lVar45 + 1;
  } while ((int)lVar45 != 8);
  return;
}

Assistant:

static void DitherCombine8x8_C(const uint8_t* WEBP_RESTRICT dither,
                               uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  int i, j;
  for (j = 0; j < 8; ++j) {
    for (i = 0; i < 8; ++i) {
      const int delta0 = dither[i] - VP8_DITHER_AMP_CENTER;
      const int delta1 =
          (delta0 + VP8_DITHER_DESCALE_ROUNDER) >> VP8_DITHER_DESCALE;
      dst[i] = clip_8b((int)dst[i] + delta1);
    }
    dst += dst_stride;
    dither += 8;
  }
}